

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char_const*>(XmlWriter *this,string *name,char **attribute)

{
  XmlWriter *pXVar1;
  ReusableStringStream rss;
  ReusableStringStream *in_stack_ffffffffffffff78;
  ReusableStringStream *in_stack_ffffffffffffff80;
  string local_60 [16];
  ReusableStringStream *in_stack_ffffffffffffffb0;
  ReusableStringStream *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  XmlWriter *in_stack_ffffffffffffffe0;
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffb0);
  ReusableStringStream::operator<<(in_stack_ffffffffffffff80,(char **)in_stack_ffffffffffffff78);
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff78);
  pXVar1 = writeAttribute(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                          in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_60);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffc0);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }